

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkPredict_VariableOrder(ARKodeMem ark_mem,realtype tau,N_Vector yguess)

{
  int iVar1;
  char *msgfmt;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "ARKodeMem structure is NULL";
    ark_mem = (ARKodeMem)0x0;
  }
  else {
    if (ark_mem->interp != (ARKInterp)0x0) {
      iVar1 = 3;
      if (0.5 < tau) {
        iVar1 = 2 - (uint)(0.75 < tau);
      }
      iVar1 = arkInterpEvaluate(ark_mem,ark_mem->interp,tau,0,iVar1,yguess);
      return iVar1;
    }
    msgfmt = "ARKodeInterpMem structure is NULL";
  }
  arkProcessError(ark_mem,-0x15,"ARKode","arkPredict_VariableOrder",msgfmt);
  return -0x15;
}

Assistant:

int arkPredict_VariableOrder(ARKodeMem ark_mem, realtype tau, N_Vector yguess)
{
  int ord;
  realtype tau_tol  = 0.5;
  realtype tau_tol2 = 0.75;

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkPredict_VariableOrder",
                    "ARKodeMem structure is NULL");
    return(ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkPredict_VariableOrder",
                    "ARKodeInterpMem structure is NULL");
    return(ARK_MEM_NULL);
  }

  /* set the polynomial order based on tau input */
  if (tau <= tau_tol) {
    ord = 3;
  } else if (tau <= tau_tol2) {
    ord = 2;
  } else {
    ord = 1;
  }

  /* call the interpolation module to do the work */
  return(arkInterpEvaluate(ark_mem, ark_mem->interp, tau,
                           0, ord, yguess));
}